

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

float4x4 *
ConvexDecomposition::MatrixLookAt
          (float4x4 *__return_storage_ptr__,float3 *eye,float3 *at,float3 *up)

{
  undefined1 auVar6 [56];
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  float3 fVar7;
  float3 local_78;
  undefined1 local_68 [32];
  float4 fStack_48;
  float4 local_38;
  
  fStack_48.x = 0.0;
  fStack_48.y = 0.0;
  fStack_48.z = 0.0;
  fStack_48.w = 0.0;
  local_68._0_4_ = 0.0;
  local_68._4_4_ = 0.0;
  local_68._8_4_ = 0.0;
  local_68._12_4_ = 0.0;
  local_68._16_4_ = 0.0;
  local_68._20_4_ = 0.0;
  local_68._24_4_ = 0.0;
  local_68._28_4_ = 0.0;
  local_38.w = 1.0;
  local_38.x = eye->x;
  local_38.y = eye->y;
  local_38.z = eye->z;
  auVar6 = ZEXT856(0);
  fVar7 = operator-(eye,at);
  local_78.z = fVar7.z;
  auVar1._0_8_ = fVar7._0_8_;
  auVar1._8_56_ = auVar6;
  local_78._0_8_ = vmovlps_avx(auVar1._0_16_);
  fVar7 = normalize(&local_78);
  auVar2._0_8_ = fVar7._0_8_;
  auVar2._8_56_ = auVar6;
  fStack_48._0_8_ = vmovlps_avx(auVar2._0_16_);
  fStack_48.z = fVar7.z;
  fVar7 = cross(up,(float3 *)(local_68 + 0x20));
  local_78.z = fVar7.z;
  auVar3._0_8_ = fVar7._0_8_;
  auVar3._8_56_ = auVar6;
  local_78._0_8_ = vmovlps_avx(auVar3._0_16_);
  fVar7 = normalize(&local_78);
  auVar4._0_8_ = fVar7._0_8_;
  auVar4._8_56_ = auVar6;
  local_68._0_8_ = vmovlps_avx(auVar4._0_16_);
  local_68._8_4_ = fVar7.z;
  fVar7 = cross((float3 *)(local_68 + 0x20),(float3 *)local_68);
  auVar5._0_8_ = fVar7._0_8_;
  auVar5._8_56_ = auVar6;
  local_68._16_8_ = vmovlps_avx(auVar5._0_16_);
  local_68._24_4_ = fVar7.z;
  MatrixRigidInverse(__return_storage_ptr__,(float4x4 *)local_68);
  return __return_storage_ptr__;
}

Assistant:

float4x4 MatrixLookAt(const float3& eye, const float3& at, const float3& up)
{
	float4x4 m;
	m.w.w = 1.0f;
	m.w.xyz() = eye;
	m.z.xyz() = normalize(eye-at);
	m.x.xyz() = normalize(cross(up,m.z.xyz()));
	m.y.xyz() = cross(m.z.xyz(),m.x.xyz());
	return MatrixRigidInverse(m);
}